

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O0

StructValues<wasm::PossibleConstantValues> * __thiscall
wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>::operator[]
          (StructValuesMap<wasm::PossibleConstantValues> *this,HeapType type)

{
  bool bVar1;
  pointer ppVar2;
  Struct *this_00;
  size_type __new_size;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>,_false,_true>,_bool>
  pVar3;
  StructValues<wasm::PossibleConstantValues> *values;
  vector<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_> local_68;
  pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>
  local_48;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>,_true>
  local_28;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>,_false,_true>,_bool>
  inserted;
  StructValuesMap<wasm::PossibleConstantValues> *this_local;
  HeapType type_local;
  
  inserted._8_8_ = this;
  this_local = (StructValuesMap<wasm::PossibleConstantValues> *)type.id;
  bVar1 = HeapType::isStruct((HeapType *)&this_local);
  if (!bVar1) {
    __assert_fail("type.isStruct()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/struct-utils.h"
                  ,0x3a,
                  "StructValues<T> &wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>::operator[](HeapType) [T = wasm::PossibleConstantValues]"
                 );
  }
  local_68.
  super__Vector_base<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_>::vector
            (&local_68);
  std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>::
  pair<wasm::HeapType_&,_true>
            (&local_48,(HeapType *)&this_local,
             (StructValues<wasm::PossibleConstantValues> *)&local_68);
  pVar3 = std::
          unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
          ::insert(&this->
                    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                   ,&local_48);
  local_28._M_cur =
       (__node_type *)
       pVar3.first.
       super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>,_true>
       ._M_cur;
  inserted.first.
  super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>,_true>
  ._M_cur._0_1_ = pVar3.second;
  std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>::
  ~pair(&local_48);
  StructValues<wasm::PossibleConstantValues>::~StructValues
            ((StructValues<wasm::PossibleConstantValues> *)&local_68);
  ppVar2 = std::__detail::
           _Node_iterator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>,_false,_true>
           ::operator->((_Node_iterator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>,_false,_true>
                         *)&local_28);
  if (((byte)inserted.first.
             super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>,_true>
             ._M_cur & 1) != 0) {
    this_00 = HeapType::getStruct((HeapType *)&this_local);
    __new_size = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&this_00->fields);
    std::vector<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_>::resize
              (&(ppVar2->second).
                super_vector<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_>
               ,__new_size);
  }
  return &ppVar2->second;
}

Assistant:

StructValues<T>& operator[](HeapType type) {
    assert(type.isStruct());
    auto inserted = this->insert({type, {}});
    auto& values = inserted.first->second;
    if (inserted.second) {
      values.resize(type.getStruct().fields.size());
    }
    return values;
  }